

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O3

int __thiscall sf::priv::JoystickImpl::open(JoystickImpl *this,char *__file,int __oflag,...)

{
  undefined1 *puVar1;
  string *psVar2;
  long lVar3;
  undefined3 uVar4;
  undefined5 uVar5;
  int __fd;
  int __fd_00;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  int *piVar10;
  long *plVar11;
  udev_device *puVar12;
  char *extraout_RAX;
  ostream *poVar13;
  ulong uVar14;
  ulong uVar15;
  string devnode_1;
  string devnode;
  char name [128];
  string local_138;
  char *local_118;
  long local_110;
  char local_108 [16];
  char *local_f8;
  long local_f0;
  char local_e8 [16];
  undefined1 local_d8 [32];
  undefined3 local_b8;
  undefined5 uStack_b5;
  undefined3 uStack_b0;
  undefined5 uStack_ad;
  undefined3 local_a8;
  undefined5 uStack_a5;
  undefined3 uStack_a0;
  undefined5 uStack_9d;
  undefined3 local_98;
  undefined5 uStack_95;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  String local_50;
  
  uVar14 = (ulong)__file & 0xffffffff;
  uVar15 = (DAT_00288770 - (anonymous_namespace)::joystickList >> 3) * -0x71c71c71c71c71c7;
  if (uVar15 < uVar14 || uVar15 - uVar14 == 0) {
    return 0;
  }
  if (*(char *)((anonymous_namespace)::joystickList + 0x40 + uVar14 * 0x48) != '\x01') {
    return 0;
  }
  plVar11 = (long *)((anonymous_namespace)::joystickList + uVar14 * 0x48);
  local_f8 = local_e8;
  lVar3 = *plVar11;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,lVar3,plVar11[1] + lVar3);
  __fd = ::open(local_f8,0x800);
  this->m_file = __fd;
  if (__fd < 0) {
    poVar13 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Failed to open joystick ",0x18);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_f8,local_f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
    piVar10 = __errno_location();
    plVar11 = (long *)std::ostream::operator<<(poVar13,*piVar10);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    goto LAB_001ec641;
  }
  ioctl(__fd,0x80406a32,this->m_mapping);
  local_118 = local_108;
  lVar3 = *(long *)((anonymous_namespace)::joystickList + uVar14 * 0x48);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,lVar3,
             *(long *)((anonymous_namespace)::joystickList + 8 + uVar14 * 0x48) + lVar3);
  __fd_00 = ::open(local_118,0x800);
  if (__fd_00 < 0) {
LAB_001ec15a:
    if (((anonymous_namespace)::udevContext != 0) &&
       (puVar12 = (udev_device *)
                  udev_device_new_from_syspath
                            ((anonymous_namespace)::udevContext,
                             *(undefined8 *)
                              ((anonymous_namespace)::joystickList + 0x20 + uVar14 * 0x48)),
       puVar12 != (udev_device *)0x0)) {
      puVar1 = local_d8 + 0x10;
      local_d8._0_3_ = SUB83(puVar1,0);
      local_d8._3_5_ = (undefined5)((ulong)puVar1 >> 0x18);
      local_d8._16_4_ = 0x646f7270;
      local_d8._8_3_ = 7;
      local_d8._11_5_ = 0;
      local_d8._20_4_ = 0x746375;
      pcVar9 = anon_unknown.dwarf_5de3b6::getUsbAttribute(puVar12,(string *)local_d8);
      if ((undefined1 *)CONCAT53(local_d8._3_5_,local_d8._0_3_) != puVar1) {
        operator_delete((undefined1 *)CONCAT53(local_d8._3_5_,local_d8._0_3_));
      }
      udev_device_unref(puVar12);
      if (pcVar9 != (char *)0x0) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        sVar8 = strlen(pcVar9);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,pcVar9,pcVar9 + sVar8);
        goto LAB_001ec320;
      }
    }
    poVar13 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"Unable to get name for joystick ",0x20);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_118,local_110);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_d8._0_3_ = 0x10;
    local_d8._3_5_ = 0;
    local_138._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)local_d8);
    local_138._M_string_length = CONCAT53(local_d8._3_5_,local_d8._0_3_);
    *(undefined8 *)local_138._M_dataplus._M_p = 0x206e776f6e6b6e55;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 8) = 'J';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 9) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 10) = 'y';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xb) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xc) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xd) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xe) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xf) = 'k';
    local_138._M_dataplus._M_p[local_138._M_string_length] = '\0';
    local_138.field_2._M_allocated_capacity = local_138._M_string_length;
  }
  else {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_95 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a5 = 0;
    uStack_a0 = 0;
    uStack_9d = 0;
    local_b8 = 0;
    uStack_b5 = 0;
    uStack_b0 = 0;
    uStack_ad = 0;
    local_d8._16_4_ = 0;
    local_d8._20_4_ = 0;
    local_d8[0x18] = '\0';
    local_d8[0x19] = '\0';
    local_d8[0x1a] = '\0';
    local_d8[0x1b] = '\0';
    local_d8._28_4_ = 0;
    local_d8._0_3_ = 0;
    local_d8._3_5_ = 0;
    local_d8._8_3_ = 0;
    local_d8._11_5_ = 0;
    iVar6 = ioctl(__fd_00,0x80806a13);
    ::close(__fd_00);
    if (iVar6 < 0) goto LAB_001ec15a;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    sVar8 = strlen(local_d8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,local_d8,local_d8 + sVar8);
  }
LAB_001ec320:
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  std::locale::locale((locale *)local_d8);
  String::String(&local_50,&local_138,(locale *)local_d8);
  String::operator=(&(this->m_identification).name,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
    operator_delete(local_50.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anonymous_namespace)::udevContext != 0) {
    puVar12 = (udev_device *)
              udev_device_new_from_syspath
                        ((anonymous_namespace)::udevContext,
                         *(undefined8 *)((anonymous_namespace)::joystickList + 0x20 + uVar14 * 0x48)
                        );
    if (puVar12 == (udev_device *)0x0) {
      poVar13 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"Failed to get vendor ID of joystick ",0x24);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,*(char **)((anonymous_namespace)::joystickList + uVar14 * 0x48),
                           *(long *)((anonymous_namespace)::joystickList + 8 + uVar14 * 0x48));
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
LAB_001ec46c:
      std::ostream::put((char)poVar13);
      uVar7 = 0;
      std::ostream::flush();
    }
    else {
      psVar2 = (string *)(local_d8 + 0x10);
      local_d8._0_3_ = SUB83(psVar2,0);
      uVar4 = local_d8._0_3_;
      local_d8._3_5_ = (undefined5)((ulong)psVar2 >> 0x18);
      uVar5 = local_d8._3_5_;
      local_d8._16_4_ = 0x565f4449;
      local_d8._20_4_ = 0x4f444e45;
      local_d8[0x18] = 'R';
      local_d8[0x19] = '_';
      local_d8[0x1a] = 'I';
      local_d8[0x1b] = 'D';
      local_d8._8_3_ = 0xc;
      local_d8._11_5_ = 0;
      local_d8._28_4_ = local_d8._28_4_ & 0xffffff00;
      uVar7 = anon_unknown.dwarf_5de3b6::getUdevAttributeUint(puVar12,psVar2);
      if ((string *)CONCAT53(local_d8._3_5_,local_d8._0_3_) != psVar2) {
        operator_delete((string *)CONCAT53(local_d8._3_5_,local_d8._0_3_));
      }
      if (uVar7 == 0) {
        local_d8._16_4_ = 0x65566469;
        local_d8._20_4_ = 0x726f646e;
        local_d8._8_3_ = 8;
        local_d8._11_5_ = 0;
        local_d8[0x18] = '\0';
        local_d8._0_3_ = uVar4;
        local_d8._3_5_ = uVar5;
        uVar7 = anon_unknown.dwarf_5de3b6::getUsbAttributeUint(puVar12,(string *)local_d8);
        if ((string *)CONCAT53(local_d8._3_5_,local_d8._0_3_) != psVar2) {
          operator_delete((string *)CONCAT53(local_d8._3_5_,local_d8._0_3_));
        }
        udev_device_unref(puVar12);
        if (uVar7 == 0) {
          poVar13 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"Failed to get vendor ID of joystick ",0x24);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,*(char **)((anonymous_namespace)::joystickList +
                                                 uVar14 * 0x48),
                               *(long *)((anonymous_namespace)::joystickList + 8 + uVar14 * 0x48));
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          goto LAB_001ec46c;
        }
      }
      else {
        udev_device_unref(puVar12);
      }
    }
    (this->m_identification).vendorId = uVar7;
    if ((anonymous_namespace)::udevContext == 0) {
      poVar13 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"Failed to get product ID of joystick ",0x25);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,*(char **)((anonymous_namespace)::joystickList + uVar14 * 0x48),
                           *(long *)((anonymous_namespace)::joystickList + 8 + uVar14 * 0x48));
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
LAB_001ec5f7:
      std::ostream::put((char)poVar13);
      uVar7 = 0;
      std::ostream::flush();
    }
    else {
      puVar12 = (udev_device *)
                udev_device_new_from_syspath
                          ((anonymous_namespace)::udevContext,
                           *(undefined8 *)
                            ((anonymous_namespace)::joystickList + 0x20 + uVar14 * 0x48));
      if (puVar12 == (udev_device *)0x0) {
        poVar13 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"Failed to get product ID of joystick ",0x25);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,*(char **)((anonymous_namespace)::joystickList + uVar14 * 0x48)
                             ,*(long *)((anonymous_namespace)::joystickList + 8 + uVar14 * 0x48));
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        goto LAB_001ec5f7;
      }
      psVar2 = (string *)(local_d8 + 0x10);
      local_d8._0_3_ = SUB83(psVar2,0);
      uVar4 = local_d8._0_3_;
      local_d8._3_5_ = (undefined5)((ulong)psVar2 >> 0x18);
      uVar5 = local_d8._3_5_;
      local_d8._16_4_ = 0x4d5f4449;
      local_d8._20_4_ = 0x4c45444f;
      local_d8[0x18] = '_';
      local_d8[0x19] = 'I';
      local_d8[0x1a] = 'D';
      local_d8._8_3_ = 0xb;
      local_d8._11_5_ = 0;
      local_d8[0x1b] = '\0';
      uVar7 = anon_unknown.dwarf_5de3b6::getUdevAttributeUint(puVar12,psVar2);
      if ((string *)CONCAT53(local_d8._3_5_,local_d8._0_3_) != psVar2) {
        operator_delete((string *)CONCAT53(local_d8._3_5_,local_d8._0_3_));
      }
      if (uVar7 == 0) {
        local_d8._16_4_ = 0x72506469;
        local_d8._20_4_ = 0x6375646f;
        local_d8[0x18] = 't';
        local_d8[0x19] = '\0';
        local_d8._8_3_ = 9;
        local_d8._11_5_ = 0;
        local_d8._0_3_ = uVar4;
        local_d8._3_5_ = uVar5;
        uVar7 = anon_unknown.dwarf_5de3b6::getUsbAttributeUint(puVar12,(string *)local_d8);
        if ((string *)CONCAT53(local_d8._3_5_,local_d8._0_3_) != psVar2) {
          operator_delete((string *)CONCAT53(local_d8._3_5_,local_d8._0_3_));
        }
        udev_device_unref(puVar12);
        if (uVar7 == 0) {
          poVar13 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"Failed to get product ID of joystick ",0x25);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,*(char **)((anonymous_namespace)::joystickList +
                                                 uVar14 * 0x48),
                               *(long *)((anonymous_namespace)::joystickList + 8 + uVar14 * 0x48));
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          goto LAB_001ec5f7;
        }
      }
      else {
        udev_device_unref(puVar12);
      }
    }
    (this->m_identification).productId = uVar7;
  }
  uStack_a5 = 0;
  uStack_a0 = 0;
  uStack_9d = 0;
  local_98 = 0;
  uStack_b5 = 0;
  uStack_b0 = 0;
  uStack_ad = 0;
  local_a8 = 0;
  local_d8._20_4_ = 0;
  local_d8[0x18] = '\0';
  local_d8[0x19] = '\0';
  local_d8[0x1a] = '\0';
  local_d8[0x1b] = '\0';
  local_d8._28_4_ = 0;
  local_b8 = 0;
  local_d8._3_5_ = 0;
  local_d8._8_3_ = 0;
  local_d8._11_5_ = 0;
  local_d8._16_4_ = 0;
  (this->m_state).connected = false;
  memcpy(&(this->m_state).field_0x1,local_d8,0x43);
LAB_001ec641:
  pcVar9 = local_e8;
  if (local_f8 != pcVar9) {
    operator_delete(local_f8);
    pcVar9 = extraout_RAX;
  }
  if (__fd < 0) {
    return 0;
  }
  return (int)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
}

Assistant:

bool JoystickImpl::open(unsigned int index)
{
    if (index >= joystickList.size())
        return false;

    if (joystickList[index].plugged)
    {
        std::string devnode = joystickList[index].deviceNode;

        // Open the joystick's file descriptor (read-only and non-blocking)
        m_file = ::open(devnode.c_str(), O_RDONLY | O_NONBLOCK);
        if (m_file >= 0)
        {
            // Retrieve the axes mapping
            ioctl(m_file, JSIOCGAXMAP, m_mapping);

            // Get info
            m_identification.name = getJoystickName(index);

            if (udevContext)
            {
                m_identification.vendorId  = getJoystickVendorId(index);
                m_identification.productId = getJoystickProductId(index);
            }

            // Reset the joystick state
            m_state = JoystickState();

            return true;
        }
        else
        {
            err() << "Failed to open joystick " << devnode << ": " << errno << std::endl;
        }
    }

    return false;
}